

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O3

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined6 in_register_0000000a;
  uint uVar7;
  uint uVar8;
  undefined6 in_register_00000012;
  uint uVar9;
  undefined6 in_register_00000032;
  ulong uVar10;
  undefined6 in_register_0000003a;
  ulong uVar11;
  uint uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint local_38;
  
  uVar11 = CONCAT62(in_register_0000003a,x1);
  uVar10 = CONCAT62(in_register_00000032,y1);
  uVar3 = (int)CONCAT62(in_register_00000012,x2) - (int)uVar11;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar4 = (int)CONCAT62(in_register_0000000a,y2) - (int)uVar10;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar7 = -(uint)(x2 < x1) | 1;
  uVar4 = -(uint)(y2 < y1) | 1;
  if (uVar1 < uVar3) {
    uVar8 = 0;
    uVar6 = uVar4;
    uVar4 = 0;
    uVar9 = uVar1;
    uVar1 = uVar3;
    local_38 = uVar7;
  }
  else {
    local_38 = 0;
    uVar6 = 0;
    uVar8 = uVar7;
    uVar9 = uVar3;
  }
  uVar3 = uVar1 >> 1;
  uVar7 = ~uVar1;
  uVar14 = gstI80DevInfo.usPanelW;
  uVar13 = gstI80DevInfo.usPanelH;
  do {
    if (((ushort)uVar11 < uVar14) && ((ushort)uVar10 < uVar13)) {
      gpFrameBuf[(ulong)((uint)uVar11 & 0xffff) + (ulong)uVar14 * (ulong)((uint)uVar10 & 0xffff)] =
           color;
      uVar14 = gstI80DevInfo.usPanelW;
      uVar13 = gstI80DevInfo.usPanelH;
    }
    uVar5 = uVar1;
    uVar2 = local_38;
    uVar12 = uVar4;
    if (uVar3 + uVar9 < uVar1) {
      uVar12 = 0;
      uVar5 = 0;
      uVar2 = 0;
    }
    uVar3 = (uVar3 + uVar9) - uVar5;
    uVar11 = (ulong)((uint)uVar11 + uVar8 + uVar2);
    uVar10 = (ulong)((uint)uVar10 + uVar6 + uVar12);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0);
  return;
}

Assistant:

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)
{
	  uint32_t deltax = 0, deltay = 0, x = 0, y = 0, xinc1 = 0, xinc2 = 0, 
	  yinc1 = 0, yinc2 = 0, den = 0, num = 0, num_add = 0, num_pixels = 0, 
	  curpixel = 0;
	  
	  deltax = ABS(x2 - x1);        /* The difference between the x's */
	  deltay = ABS(y2 - y1);        /* The difference between the y's */
	  x = x1;                       /* Start x off at the first pixel */
	  y = y1;                       /* Start y off at the first pixel */
	  
	  if (x2 >= x1)                 /* The x-values are increasing */
	  {
		    xinc1 = 1;
		    xinc2 = 1;
	  }
	  else                          /* The x-values are decreasing */
	  {
		    xinc1 = -1;
		    xinc2 = -1;
	  }
	  
	  if (y2 >= y1)                 /* The y-values are increasing */
	  {
		    yinc1 = 1;
		    yinc2 = 1;
	  }
	  else                          /* The y-values are decreasing */
	  {
		    yinc1 = -1;
		    yinc2 = -1;
	  }
	  
	  if (deltax >= deltay)         /* There is at least one x-value for every y-value */
	  {
		    xinc1 = 0;              /* Don't change the x when numerator >= denominator */
		    yinc2 = 0;              /* Don't change the y for every iteration */
		    den = deltax;
		    num = deltax / 2;
		    num_add = deltay;
		    num_pixels = deltax;    /* There are more x-values than y-values */
	  }
	  else                          /* There is at least one y-value for every x-value */
	  {
		    xinc2 = 0;              /* Don't change the x for every iteration */
		    yinc1 = 0;              /* Don't change the y when numerator >= denominator */
		    den = deltay;
		    num = deltay / 2;
		    num_add = deltax;
		    num_pixels = deltay;    /* There are more y-values than x-values */
	  }
	  
	  for (curpixel = 0; curpixel <= num_pixels; curpixel++)
	  {
		    EPD_DrawPixel(x, y, color);          /* Draw the current pixel */
		    num += num_add;                      /* Increase the numerator by the top of the fraction */
		    if (num >= den)                      /* Check if numerator >= denominator */
		    {
			      num -= den;                    /* Calculate the new numerator value */
			      x += xinc1;                    /* Change the x as appropriate */
			      y += yinc1;                    /* Change the y as appropriate */
		    }
		    x += xinc2;                          /* Change the x as appropriate */
		    y += yinc2;                          /* Change the y as appropriate */
	  }
}